

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_abs<float>(uint length)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [12];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  int iVar30;
  float *__p;
  long lVar31;
  ulong uVar32;
  undefined8 *puVar33;
  undefined1 (*pauVar34) [12];
  undefined1 (*pauVar35) [12];
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 (*local_b8) [12];
  shared_ptr<float> pv;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  
  __p = nosimd::common::malloc<float>(length);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)&local_b8,__p,
             nosimd::common::free<float>);
  lVar31 = 0;
  uVar37 = 0;
  pauVar34 = local_b8;
  if (0 < (int)length) {
    uVar37 = (ulong)length;
  }
  for (; pauVar35 = local_b8, uVar36 = length, -lVar31 != uVar37; lVar31 = lVar31 + -1) {
    *(float *)*pauVar34 = (float)(int)lVar31;
    pauVar34 = (undefined1 (*) [12])(*pauVar34 + 4);
  }
  for (; 0xf < (int)uVar36; uVar36 = uVar36 - 0x10) {
    uVar1 = *(uint *)*pauVar35;
    uVar7 = *(uint *)(*pauVar35 + 4);
    uVar10 = *(uint *)(*pauVar35 + 8);
    uVar13 = *(uint *)pauVar35[1];
    uVar14 = *(uint *)(pauVar35[1] + 4);
    uVar4 = *(uint *)(pauVar35[1] + 8);
    uVar6 = *(uint *)pauVar35[2];
    uVar9 = *(uint *)(pauVar35[2] + 4);
    uVar12 = *(uint *)(pauVar35[2] + 8);
    uVar15 = *(uint *)pauVar35[3];
    uVar16 = *(uint *)(pauVar35[3] + 4);
    uVar17 = *(uint *)(pauVar35[3] + 8);
    local_48 = *(uint *)pauVar35[4];
    uStack_44 = *(uint *)(pauVar35[4] + 4);
    uStack_40 = *(uint *)(pauVar35[4] + 8);
    auVar19 = pauVar35[4];
    uVar18 = *(uint *)pauVar35[5];
    if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
      iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask);
      local_48 = auVar19._0_4_;
      uStack_44 = auVar19._4_4_;
      uStack_40 = auVar19._8_4_;
      if (iVar30 != 0) {
        sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
        __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
      }
    }
    uVar27 = sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    uVar24 = sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar22 = sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar20 = sse::internals::abs_ps(float(int))::sign_mask._0_4_;
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar30 != 0))
    {
      sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    uVar28 = sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    uVar25 = sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar23 = sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar21 = sse::internals::abs_ps(float(int))::sign_mask._0_4_;
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar30 != 0))
    {
      sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    uVar29 = sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    uVar26 = sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar38 = sse::internals::abs_ps(float(int))::sign_mask._0_4_;
    uVar39 = sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
      pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           sse::internals::abs_ps(float(int))::sign_mask._0_4_;
      pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           sse::internals::abs_ps(float(int))::sign_mask._4_4_;
      iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask);
      uVar38 = (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      uVar39 = pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      if (iVar30 != 0) {
        sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
        __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
        uVar38 = (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar39 = pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      }
    }
    uVar3 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_;
    uVar5 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar8 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar11 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    *(uint *)*pauVar35 = ~uVar20 & uVar1;
    *(uint *)(*pauVar35 + 4) = ~uVar22 & uVar7;
    *(uint *)(*pauVar35 + 8) = ~uVar24 & uVar10;
    *(uint *)pauVar35[1] = ~uVar27 & uVar13;
    *(uint *)(pauVar35[1] + 4) = ~uVar21 & uVar14;
    *(uint *)(pauVar35[1] + 8) = ~uVar23 & uVar4;
    *(uint *)pauVar35[2] = ~uVar25 & uVar6;
    *(uint *)(pauVar35[2] + 4) = ~uVar28 & uVar9;
    *(uint *)(pauVar35[2] + 8) = ~uVar38 & uVar12;
    *(uint *)pauVar35[3] = ~uVar39 & uVar15;
    *(uint *)(pauVar35[3] + 4) = ~uVar26 & uVar16;
    *(uint *)(pauVar35[3] + 8) = ~uVar29 & uVar17;
    *(uint *)pauVar35[4] = uVar3 & local_48;
    *(uint *)(pauVar35[4] + 4) = uVar5 & uStack_44;
    *(uint *)(pauVar35[4] + 8) = uVar8 & uStack_40;
    *(uint *)pauVar35[5] = uVar11 & uVar18;
    pauVar35 = (undefined1 (*) [12])(pauVar35[5] + 4);
  }
  for (; 7 < (int)uVar36; uVar36 = uVar36 - 8) {
    uVar1 = *(uint *)*pauVar35;
    uVar7 = *(uint *)(*pauVar35 + 4);
    uVar10 = *(uint *)(*pauVar35 + 8);
    uVar13 = *(uint *)pauVar35[1];
    local_48 = *(uint *)*(undefined1 (*) [12])(pauVar35[1] + 4);
    uStack_44 = *(uint *)(pauVar35[1] + 8);
    uStack_40 = *(uint *)pauVar35[2];
    auVar19 = *(undefined1 (*) [12])(pauVar35[1] + 4);
    uVar14 = *(uint *)(pauVar35[2] + 4);
    if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
      iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask);
      local_48 = auVar19._0_4_;
      uStack_44 = auVar19._4_4_;
      uStack_40 = auVar19._8_4_;
      if (iVar30 != 0) {
        sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
        __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
      }
    }
    uVar27 = sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    uVar24 = sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar22 = sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar20 = sse::internals::abs_ps(float(int))::sign_mask._0_4_;
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar30 != 0))
    {
      sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    uVar4 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_;
    uVar6 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar9 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar12 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    *(uint *)*pauVar35 = ~uVar20 & uVar1;
    *(uint *)(*pauVar35 + 4) = ~uVar22 & uVar7;
    *(uint *)(*pauVar35 + 8) = ~uVar24 & uVar10;
    *(uint *)pauVar35[1] = ~uVar27 & uVar13;
    *(uint *)(pauVar35[1] + 4) = uVar4 & local_48;
    *(uint *)(pauVar35[1] + 8) = uVar6 & uStack_44;
    *(uint *)pauVar35[2] = uVar9 & uStack_40;
    *(uint *)(pauVar35[2] + 4) = uVar12 & uVar14;
    pauVar35 = (undefined1 (*) [12])(pauVar35[2] + 8);
  }
  if (3 < (int)uVar36) {
    local_48 = *(uint *)*pauVar35;
    uStack_44 = *(uint *)(*pauVar35 + 4);
    uStack_40 = *(uint *)(*pauVar35 + 8);
    auVar19 = *pauVar35;
    uVar1 = *(uint *)pauVar35[1];
    if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
      iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask);
      local_48 = auVar19._0_4_;
      uStack_44 = auVar19._4_4_;
      uStack_40 = auVar19._8_4_;
      if (iVar30 != 0) {
        sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
        sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
        __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
      }
    }
    uVar7 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar10 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar13 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    *(uint *)*pauVar35 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_ & local_48;
    *(uint *)(*pauVar35 + 4) = uVar7 & uStack_44;
    *(uint *)(*pauVar35 + 8) = uVar10 & uStack_40;
    *(uint *)pauVar35[1] = uVar13 & uVar1;
    uVar36 = uVar36 - 4;
    pauVar35 = (undefined1 (*) [12])(pauVar35[1] + 4);
  }
  for (; 0 < (int)uVar36; uVar36 = uVar36 - 1) {
    uVar1 = *(uint *)*pauVar35;
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar30 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar30 != 0))
    {
      sse::internals::abs_ps(float(int))::sign_mask._0_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_4_ = 0x80000000;
      sse::internals::abs_ps(float(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    *(uint *)*pauVar35 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_ & uVar1;
    pauVar35 = (undefined1 (*) [12])(*pauVar35 + 4);
  }
  uVar32 = 0;
  do {
    if (uVar37 == uVar32) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv);
      return;
    }
    fVar2 = *(float *)(*local_b8 + uVar32 * 4);
    uVar32 = uVar32 + 1;
  } while ((0.0 <= fVar2) || ((fVar2 == 1.1754944e-38 && (!NAN(fVar2)))));
  puVar33 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar33 = "void test_abs(unsigned int) [T = float]";
  *(undefined4 *)(puVar33 + 1) = 0x81;
  *(uint *)((long)puVar33 + 0xc) = length;
  __cxa_throw(puVar33,&Exception::typeinfo,0);
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}